

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

uint8_t * MuxImageEmit(WebPMuxImage *wpi,uint8_t *dst)

{
  uint32_t uVar1;
  WebPChunk *pWVar2;
  ulong __n;
  int iVar3;
  size_t sVar4;
  WebPMuxImage *chunk;
  
  pWVar2 = wpi->header_;
  if (pWVar2 != (WebPChunk *)0x0) {
    sVar4 = MuxImageDiskSize(wpi);
    __n = (pWVar2->data_).size;
    uVar1 = pWVar2->tag_;
    *dst = (uint8_t)uVar1;
    dst[1] = (uint8_t)(uVar1 >> 8);
    dst[2] = (uint8_t)(uVar1 >> 0x10);
    dst[3] = (uint8_t)(uVar1 >> 0x18);
    iVar3 = (int)sVar4 + -8;
    dst[4] = (uint8_t)iVar3;
    dst[5] = (uint8_t)((uint)iVar3 >> 8);
    dst[6] = (uint8_t)((uint)iVar3 >> 0x10);
    dst[7] = (uint8_t)((uint)iVar3 >> 0x18);
    memcpy(dst + 8,(pWVar2->data_).bytes,__n);
    if ((__n & 1) != 0) {
      dst[__n + 8] = '\0';
    }
    dst = dst + (ulong)((int)(pWVar2->data_).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->alpha_ != (WebPChunk *)0x0) {
    dst = ChunkEmit(wpi->alpha_,dst);
  }
  chunk = (WebPMuxImage *)wpi->img_;
  if (chunk != (WebPMuxImage *)0x0) goto LAB_00106a56;
  while (chunk = (WebPMuxImage *)wpi->unknown_, wpi = chunk, chunk != (WebPMuxImage *)0x0) {
LAB_00106a56:
    dst = ChunkEmit((WebPChunk *)chunk,dst);
  }
  return dst;
}

Assistant:

uint8_t* MuxImageEmit(const WebPMuxImage* const wpi, uint8_t* dst) {
  // Ordering of chunks to be emitted is strictly as follows:
  // 1. ANMF chunk (if present).
  // 2. ALPH chunk (if present).
  // 3. VP8/VP8L chunk.
  assert(wpi);
  if (wpi->header_ != NULL) {
    dst = ChunkEmitSpecial(wpi->header_, MuxImageDiskSize(wpi), dst);
  }
  if (wpi->alpha_ != NULL) dst = ChunkEmit(wpi->alpha_, dst);
  if (wpi->img_ != NULL) dst = ChunkEmit(wpi->img_, dst);
  if (wpi->unknown_ != NULL) dst = ChunkListEmit(wpi->unknown_, dst);
  return dst;
}